

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

array<float,_3>
pbrt::SampleSphericalTriangle(array<pbrt::Point3<float>,_3> *v,Point3f *p,Point2f *u,Float *pdf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar3;
  float *in_RCX;
  Tuple2<pbrt::Point2,_float> *in_RDX;
  array<pbrt::Point3<float>,_3> *in_RDI;
  long *in_FS_OFFSET;
  float fVar4;
  float fVar5;
  float fVar6;
  initializer_list<float> v_00;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar22 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar23 [64];
  double dVar7;
  double dVar8;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  Vector3<float> VVar41;
  array<float,_3> aVar42;
  Float b2;
  Vector3f s2;
  Float b1;
  Vector3f s;
  Float invDivisor;
  Float divisor;
  Vector3f s1;
  Vector3f e2;
  Vector3f e1;
  Vector3f w;
  Float sinTheta;
  Float cosTheta;
  Vector3f cp;
  Float sinBetap;
  Float cosBetap;
  Float vv;
  Float uu;
  Float cosPhi;
  Float sinPhi;
  Float sinAlpha;
  Float cosAlpha;
  Float Ap;
  Float A;
  Float gamma;
  Float beta;
  Float alpha;
  Vector3f n_ca;
  Vector3f n_bc;
  Vector3f n_ab;
  int vb_2;
  float va_2;
  int vb_1;
  float va_1;
  int vb;
  float va;
  Vector3f c;
  Vector3f b;
  Vector3f a;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffa60;
  Point3<float> *in_stack_fffffffffffffa68;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffa70;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffa78;
  Vector3<float> *in_stack_fffffffffffffa80;
  Tuple3<pbrt::Vector3,_float> *func;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined1 in_stack_fffffffffffffa98 [16];
  char (*in_stack_fffffffffffffaa8) [2];
  undefined4 in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  int iVar43;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  float fVar44;
  undefined8 in_stack_fffffffffffffac0;
  LogLevel level;
  char *in_stack_fffffffffffffac8;
  LogLevel in_stack_fffffffffffffad4;
  char (*local_528) [17];
  float *in_stack_fffffffffffffae8;
  char (*in_stack_fffffffffffffaf0) [2];
  int *in_stack_fffffffffffffaf8;
  size_t i;
  float local_49c;
  float local_498;
  float local_494;
  float *local_490;
  undefined8 local_488;
  float local_47c;
  Tuple3<pbrt::Vector3,_float> local_478;
  Tuple3<pbrt::Vector3,_float> local_468;
  float local_45c;
  Tuple3<pbrt::Vector3,_float> local_458;
  Tuple3<pbrt::Vector3,_float> local_448;
  float local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 *local_428;
  undefined8 local_420;
  __0 local_405;
  float local_404;
  Tuple3<pbrt::Vector3,_float> local_400;
  Tuple3<pbrt::Vector3,_float> local_3ec;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d0;
  float local_3c8;
  Tuple3<pbrt::Vector3,_float> local_3c0;
  Tuple3<pbrt::Vector3,_float> local_3b0;
  Tuple3<pbrt::Vector3,_float> local_3a0;
  undefined8 local_390;
  float local_388;
  undefined8 local_380;
  float local_378;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  Tuple3<pbrt::Vector3,_float> local_310;
  float local_300;
  uint local_2fc;
  Tuple3<pbrt::Vector3,_float> local_2f8;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  Tuple3<pbrt::Vector3,_float> local_268;
  float local_258;
  float local_254;
  uint local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  Float local_214;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  Float local_1f4;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  Float local_1d4;
  Tuple3<pbrt::Vector3,_float> local_1d0;
  Tuple3<pbrt::Vector3,_float> local_1c0;
  Tuple3<pbrt::Vector3,_float> local_1b0;
  Tuple3<pbrt::Vector3,_float> local_1a0;
  Tuple3<pbrt::Vector3,_float> local_190;
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Vector3,_float> local_150;
  Tuple3<pbrt::Vector3,_float> local_140;
  Tuple3<pbrt::Vector3,_float> local_130;
  Tuple3<pbrt::Vector3,_float> local_120;
  Tuple3<pbrt::Vector3,_float> local_110;
  Tuple3<pbrt::Vector3,_float> local_100;
  Tuple3<pbrt::Vector3,_float> local_f0;
  Tuple3<pbrt::Vector3,_float> local_e0;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  undefined4 local_b0;
  float local_ac;
  undefined4 local_a8;
  float local_a4;
  undefined4 local_a0;
  float local_9c;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  float *local_38;
  Tuple2<pbrt::Point2,_float> *local_30;
  array<pbrt::Point3<float>,_3> *local_20;
  array<float,_3> local_14;
  undefined8 uVar45;
  undefined1 extraout_var [60];
  undefined1 auVar40 [56];
  float fVar46;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffac0 >> 0x20);
  auVar40 = in_ZMM0._8_56_;
  if (in_RCX != (float *)0x0) {
    auVar40 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    *in_RCX = 0.0;
  }
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_20 = in_RDI;
  pstd::array<pbrt::Point3<float>,_3>::operator[](in_RDI,0);
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  local_58.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar40;
  local_58._0_8_ = vmovlpd_avx(auVar9._0_16_);
  local_48._0_8_ = local_58._0_8_;
  local_48.z = local_58.z;
  pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,1);
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  local_78.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar40;
  local_78._0_8_ = vmovlpd_avx(auVar10._0_16_);
  local_68._0_8_ = local_78._0_8_;
  local_68.z = local_78.z;
  pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,2);
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  local_98.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar40;
  local_98._0_8_ = vmovlpd_avx(auVar11._0_16_);
  local_88._0_8_ = local_98._0_8_;
  local_88.z = local_98.z;
  local_9c = LengthSquared<float>((Vector3<float> *)&local_48);
  local_a0 = 0;
  if (local_9c <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (in_stack_fffffffffffffad4,in_stack_fffffffffffffac8,level,
               (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (char (*) [17])CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8,local_528,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8);
  }
  local_a4 = LengthSquared<float>((Vector3<float> *)&local_68);
  local_a8 = 0;
  if (local_a4 <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (in_stack_fffffffffffffad4,in_stack_fffffffffffffac8,level,
               (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (char (*) [17])CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8,local_528,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8);
  }
  local_ac = LengthSquared<float>((Vector3<float> *)&local_88);
  local_b0 = 0;
  auVar40 = (undefined1  [56])0x0;
  if (local_ac <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (in_stack_fffffffffffffad4,in_stack_fffffffffffffac8,level,
               (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (char (*) [17])CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8,local_528,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8);
  }
  VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
  local_d0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar40;
  local_d0._0_8_ = vmovlpd_avx(auVar12._0_16_);
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_48._0_8_ = local_d0._0_8_;
  local_48.z = local_d0.z;
  VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
  local_f0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar40;
  local_f0._0_8_ = vmovlpd_avx(auVar13._0_16_);
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_68._0_8_ = local_f0._0_8_;
  local_68.z = local_f0.z;
  VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
  local_110.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar40;
  local_110._0_8_ = vmovlpd_avx(auVar14._0_16_);
  local_100._0_8_ = local_110._0_8_;
  local_100.z = local_110.z;
  local_88._0_8_ = local_110._0_8_;
  local_88.z = local_110.z;
  VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa70,
                        (Vector3<float> *)in_stack_fffffffffffffa68);
  local_130.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar40;
  local_130._0_8_ = vmovlpd_avx(auVar15._0_16_);
  local_120._0_8_ = local_130._0_8_;
  local_120.z = local_130.z;
  VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa70,
                        (Vector3<float> *)in_stack_fffffffffffffa68);
  local_150.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar40;
  local_150._0_8_ = vmovlpd_avx(auVar16._0_16_);
  local_140._0_8_ = local_150._0_8_;
  local_140.z = local_150.z;
  VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa70,
                        (Vector3<float> *)in_stack_fffffffffffffa68);
  local_170.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar40;
  local_170._0_8_ = vmovlpd_avx(auVar17._0_16_);
  local_160._0_8_ = local_170._0_8_;
  local_160.z = local_170.z;
  fVar4 = LengthSquared<float>((Vector3<float> *)&local_120);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = LengthSquared<float>((Vector3<float> *)&local_140);
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      fVar4 = LengthSquared<float>((Vector3<float> *)&local_160);
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        auVar40 = extraout_var_00;
        VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
        local_190.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar18._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar18._8_56_ = auVar40;
        local_190._0_8_ = vmovlpd_avx(auVar18._0_16_);
        local_180._0_8_ = local_190._0_8_;
        local_180.z = local_190.z;
        local_120._0_8_ = local_190._0_8_;
        local_120.z = local_190.z;
        VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
        local_1b0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar19._8_56_ = auVar40;
        local_1b0._0_8_ = vmovlpd_avx(auVar19._0_16_);
        local_1a0._0_8_ = local_1b0._0_8_;
        local_1a0.z = local_1b0.z;
        local_140._0_8_ = local_1b0._0_8_;
        local_140.z = local_1b0.z;
        VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
        local_1d0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar20._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar20._8_56_ = auVar40;
        local_1d0._0_8_ = vmovlpd_avx(auVar20._0_16_);
        local_1c0._0_8_ = local_1d0._0_8_;
        local_1c0.z = local_1d0.z;
        local_160._0_8_ = local_1d0._0_8_;
        local_160.z = local_1d0.z;
        VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa60);
        local_1e8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar21._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar21._8_56_ = auVar40;
        local_1f0 = vmovlpd_avx(auVar21._0_16_);
        local_1e0 = local_1f0;
        local_1d8 = local_1e8;
        local_1d4 = AngleBetween<float>(in_stack_fffffffffffffa98._0_8_,
                                        (Vector3<float> *)
                                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90
                                                ));
        auVar40 = extraout_var_01;
        VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa60);
        local_208 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar22._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar22._8_56_ = auVar40;
        local_210 = vmovlpd_avx(auVar22._0_16_);
        local_200 = local_210;
        local_1f8 = local_208;
        local_1f4 = AngleBetween<float>(in_stack_fffffffffffffa98._0_8_,
                                        (Vector3<float> *)
                                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90
                                                ));
        auVar40 = extraout_var_02;
        VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa60);
        local_228 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar23._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar23._8_56_ = auVar40;
        local_230 = vmovlpd_avx(auVar23._0_16_);
        local_220 = local_230;
        local_218 = local_228;
        local_214 = AngleBetween<float>(in_stack_fffffffffffffa98._0_8_,
                                        (Vector3<float> *)
                                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90
                                                ));
        local_234 = (local_1d4 + local_1f4 + local_214) - 3.1415927;
        if (0.0 < local_234) {
          if (local_38 != (float *)0x0) {
            *local_38 = 1.0 / local_234;
          }
          local_238 = Tuple2<pbrt::Point2,_float>::operator[](local_30,0);
          local_238 = local_238 * local_234;
          dVar7 = std::cos((double)(ulong)(uint)local_1d4);
          local_23c = SUB84(dVar7,0);
          dVar7 = std::sin((double)(ulong)(uint)local_1d4);
          local_240 = SUB84(dVar7,0);
          dVar7 = std::sin((double)(ulong)(uint)local_238);
          fVar4 = local_23c;
          dVar8 = std::cos((double)(ulong)(uint)local_238);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416(SUB84(dVar7,0)),
                                   ZEXT416((uint)-(SUB84(dVar8,0) * local_240)));
          local_244 = auVar1._0_4_;
          dVar7 = std::cos((double)(ulong)(uint)local_238);
          fVar6 = local_23c;
          dVar8 = std::sin((double)(ulong)(uint)local_238);
          fVar5 = local_240;
          fVar4 = local_244;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416(SUB84(dVar7,0)),
                                   ZEXT416((uint)(SUB84(dVar8,0) * local_240)));
          local_248 = auVar1._0_4_;
          local_24c = local_248 - local_23c;
          auVar24._0_4_ = Dot<float>((Vector3<float> *)&local_48,(Vector3<float> *)&local_68);
          auVar24._4_60_ = extraout_var;
          auVar1 = vfmadd213ss_fma(auVar24._0_16_,ZEXT416((uint)fVar5),ZEXT416((uint)fVar4));
          local_250 = auVar1._0_4_;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_248),ZEXT416(local_250),
                                   ZEXT416((uint)-(local_24c * local_244)));
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_23c),auVar1,ZEXT416(local_250 ^ 0x80000000));
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_244),ZEXT416(local_250),
                                   ZEXT416((uint)(local_24c * local_248)));
          local_254 = auVar1._0_4_ / (auVar2._0_4_ * local_240);
          eVar3 = IsNaN<float>(0.0);
          if (eVar3) {
            LogFatal<char_const(&)[17]>
                      (level,(char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                       in_stack_fffffffffffffab4,*in_stack_fffffffffffffaa8,
                       in_stack_fffffffffffffa98._8_8_);
          }
          iVar43 = 1;
          local_254 = Clamp<float,int,int>(local_254,-1,1);
          fVar44 = 1.0;
          vfnmadd213ss_fma(ZEXT416((uint)local_254),ZEXT416((uint)local_254),
                           SUB6416(ZEXT464(0x3f800000),0));
          local_258 = SafeSqrt(0.0);
          auVar40 = (undefined1  [56])0x0;
          func = &local_48;
          VVar41 = operator*((float)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                             in_stack_fffffffffffffa78);
          local_280 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar25._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar25._8_56_ = auVar40;
          local_288 = vmovlpd_avx(auVar25._0_16_);
          auVar40 = (undefined1  [56])0x0;
          fVar4 = local_258;
          local_278 = local_288;
          local_270 = local_280;
          VVar41 = GramSchmidt<float>(in_stack_fffffffffffffa98._8_8_,
                                      in_stack_fffffffffffffa98._0_8_);
          local_2c0 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar26._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar26._8_56_ = auVar40;
          local_2c8 = vmovlpd_avx(auVar26._0_16_);
          local_2b8 = local_2c8;
          local_2b0 = local_2c0;
          VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
          local_2d0 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar27._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar27._8_56_ = auVar40;
          v_00 = auVar27._0_16_;
          auVar40 = (undefined1  [56])0x0;
          local_2d8 = vmovlpd_avx((undefined1  [16])v_00);
          local_2a8 = local_2d8;
          local_2a0 = local_2d0;
          VVar41 = operator*((float)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                             in_stack_fffffffffffffa78);
          local_2e0 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar28._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar28._8_56_ = auVar40;
          local_2e8 = vmovlpd_avx(auVar28._0_16_);
          local_298 = local_2e8;
          local_290 = local_2e0;
          VVar41 = Tuple3<pbrt::Vector3,float>::operator+
                             (in_stack_fffffffffffffa70,(Vector3<float> *)in_stack_fffffffffffffa68)
          ;
          local_2f8.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar29._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar29._8_56_ = auVar40;
          local_2f8._0_8_ = vmovlpd_avx(auVar29._0_16_);
          local_268._0_8_ = local_2f8._0_8_;
          local_268.z = local_2f8.z;
          fVar5 = Tuple2<pbrt::Point2,_float>::operator[](local_30,iVar43);
          fVar6 = Dot<float>((Vector3<float> *)&local_268,(Vector3<float> *)&local_68);
          auVar1 = vfnmadd213ss_fma(ZEXT416((uint)(fVar44 - fVar6)),ZEXT416((uint)fVar5),
                                    ZEXT416((uint)fVar44));
          local_2fc = auVar1._0_4_;
          vfnmadd213ss_fma(ZEXT416(local_2fc),ZEXT416(local_2fc),ZEXT416((uint)fVar44));
          local_300 = SafeSqrt(0.0);
          auVar40 = (undefined1  [56])0x0;
          VVar41 = operator*((float)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                             in_stack_fffffffffffffa78);
          local_328 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar30._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar30._8_56_ = auVar40;
          local_330 = vmovlpd_avx(auVar30._0_16_);
          auVar40 = (undefined1  [56])0x0;
          local_320 = local_330;
          local_318 = local_328;
          VVar41 = GramSchmidt<float>((Vector3<float> *)v_00._M_len,(Vector3<float> *)v_00._M_array)
          ;
          local_368 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar31._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar31._8_56_ = auVar40;
          local_370 = vmovlpd_avx(auVar31._0_16_);
          local_360 = local_370;
          local_358 = local_368;
          VVar41 = Normalize<float>(in_stack_fffffffffffffa80);
          local_378 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar32._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar32._8_56_ = auVar40;
          auVar40 = (undefined1  [56])0x0;
          local_380 = vmovlpd_avx(auVar32._0_16_);
          local_350 = local_380;
          local_348 = local_378;
          VVar41 = operator*((float)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                             in_stack_fffffffffffffa78);
          local_388 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar33._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar33._8_56_ = auVar40;
          local_390 = vmovlpd_avx(auVar33._0_16_);
          local_340 = local_390;
          local_338 = local_388;
          VVar41 = Tuple3<pbrt::Vector3,float>::operator+
                             (in_stack_fffffffffffffa70,(Vector3<float> *)in_stack_fffffffffffffa68)
          ;
          local_3a0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar34._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar34._8_56_ = auVar40;
          local_3a0._0_8_ = vmovlpd_avx(auVar34._0_16_);
          local_310._0_8_ = local_3a0._0_8_;
          local_310.z = local_3a0.z;
          pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,1);
          i = 0;
          pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,0);
          VVar41 = Point3<float>::operator-
                             ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          local_3c0.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar35._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar35._8_56_ = auVar40;
          local_3c0._0_8_ = vmovlpd_avx(auVar35._0_16_);
          local_3b0._0_8_ = local_3c0._0_8_;
          local_3b0.z = local_3c0.z;
          pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,2);
          pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,i);
          VVar41 = Point3<float>::operator-
                             ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          local_3d8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar36._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar36._8_56_ = auVar40;
          local_3e0 = vmovlpd_avx(auVar36._0_16_);
          local_3d0 = local_3e0;
          local_3c8 = local_3d8;
          VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa70,
                                (Vector3<float> *)in_stack_fffffffffffffa68);
          local_400.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar37._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar37._8_56_ = auVar40;
          local_400._0_8_ = vmovlpd_avx(auVar37._0_16_);
          local_3ec._0_8_ = local_400._0_8_;
          local_3ec.z = local_400.z;
          local_404 = Dot<float>((Vector3<float> *)&local_3ec,(Vector3<float> *)&local_3b0);
          if ((SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
               ::reg == '\0') &&
             (iVar43 = __cxa_guard_acquire(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                            ::reg), iVar43 != 0)) {
            SampleSphericalTriangle(pstd::array_const&,pbrt::Point3_const&,pbrt::Point2_const&,float*)
            ::$_0::operator_cast_to_function_pointer(&local_405);
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)CONCAT44(fVar4,in_stack_fffffffffffffa90),(AccumFunc)func,
                       (PixelAccumFunc)in_stack_fffffffffffffa80);
            __cxa_guard_release(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                 ::reg);
          }
          *(long *)(*in_FS_OFFSET + -0x2e0) = *(long *)(*in_FS_OFFSET + -0x2e0) + 1;
          if ((local_404 == 0.0) && (!NAN(local_404))) {
            *(long *)(*in_FS_OFFSET + -0x2e8) = *(long *)(*in_FS_OFFSET + -0x2e8) + 1;
          }
          if ((local_404 != 0.0) || (NAN(local_404))) {
            local_438 = 1.0 / local_404;
            auVar40 = ZEXT856(0);
            pstd::array<pbrt::Point3<float>,_3>::operator[](local_20,0);
            VVar41 = Point3<float>::operator-
                               ((Point3<float> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68
                               );
            local_458.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar38._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar38._8_56_ = auVar40;
            local_458._0_8_ = vmovlpd_avx(auVar38._0_16_);
            local_448._0_8_ = local_458._0_8_;
            local_448.z = local_458.z;
            local_45c = Dot<float>((Vector3<float> *)&local_448,(Vector3<float> *)&local_3ec);
            local_45c = local_45c * local_438;
            auVar40 = (undefined1  [56])0x0;
            VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa70,
                                  (Vector3<float> *)in_stack_fffffffffffffa68);
            local_478.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar39._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar39._8_56_ = auVar40;
            local_478._0_8_ = vmovlpd_avx(auVar39._0_16_);
            local_468._0_8_ = local_478._0_8_;
            local_468.z = local_478.z;
            local_47c = Dot<float>((Vector3<float> *)&local_310,(Vector3<float> *)&local_468);
            local_47c = local_47c * local_438;
            local_45c = Clamp<float,int,int>(local_45c,0,1);
            local_47c = Clamp<float,int,int>(local_47c,0,1);
            if (1.0 < local_45c + local_47c) {
              local_45c = local_45c / (local_45c + local_47c);
              local_47c = local_47c / (local_45c + local_47c);
            }
            local_49c = (1.0 - local_45c) - local_47c;
            local_498 = local_45c;
            local_494 = local_47c;
            local_490 = &local_49c;
            local_488 = 3;
            pstd::array<float,_3>::array
                      ((array<float,_3> *)CONCAT44(fVar4,in_stack_fffffffffffffa90),v_00);
          }
          else {
            local_434 = 0x3eaaaaab;
            local_430 = 0x3eaaaaab;
            local_42c = 0x3eaaaaab;
            local_428 = &local_434;
            local_420 = 3;
            pstd::array<float,_3>::array
                      ((array<float,_3> *)CONCAT44(fVar4,in_stack_fffffffffffffa90),v_00);
          }
        }
        else {
          memset(&local_14,0,0xc);
          pstd::array<float,_3>::array(&local_14);
        }
        goto LAB_0052fced;
      }
    }
  }
  memset(&local_14,0,0xc);
  pstd::array<float,_3>::array(&local_14);
LAB_0052fced:
  aVar42.values[0] = local_14.values[0];
  uVar45._4_4_ = local_14.values[1];
  register0x00001240 = local_14.values[2];
  return (array<float,_3>)aVar42.values;
}

Assistant:

pstd::array<Float, 3> SampleSphericalTriangle(const pstd::array<Point3f, 3> &v,
                                              const Point3f &p, const Point2f &u,
                                              Float *pdf) {
    if (pdf != nullptr)
        *pdf = 0;
    // Compute vectors _a_, _b_, and _c_ to spherical triangle vertices
    Vector3f a(v[0] - p), b(v[1] - p), c(v[2] - p);
    CHECK_GT(LengthSquared(a), 0);
    CHECK_GT(LengthSquared(b), 0);
    CHECK_GT(LengthSquared(c), 0);
    a = Normalize(a);
    b = Normalize(b);
    c = Normalize(c);

    // Compute normalized cross products of all direction pairs
    Vector3f n_ab = Cross(a, b), n_bc = Cross(b, c), n_ca = Cross(c, a);
    if (LengthSquared(n_ab) == 0 || LengthSquared(n_bc) == 0 || LengthSquared(n_ca) == 0)
        return {};
    n_ab = Normalize(n_ab);
    n_bc = Normalize(n_bc);
    n_ca = Normalize(n_ca);

    // Compute angles $\alpha$, $\beta$, and $\gamma$ at spherical triangle vertices
    Float alpha = AngleBetween(n_ab, -n_ca);
    Float beta = AngleBetween(n_bc, -n_ab);
    Float gamma = AngleBetween(n_ca, -n_bc);

    // Uniformly sample triangle area $A$ to compute $A'$
    Float A = alpha + beta + gamma - Pi;
    if (A <= 0)
        return {};
    if (pdf != nullptr)
        *pdf = 1 / A;
    Float Ap = u[0] * A;

    // Compute $\sin \beta'$ and $\cos \beta'$ for point along _b_ for sampled area
    Float cosAlpha = std::cos(alpha), sinAlpha = std::sin(alpha);

    Float sinPhi = std::sin(Ap) * cosAlpha - std::cos(Ap) * sinAlpha;
    Float cosPhi = std::cos(Ap) * cosAlpha + std::sin(Ap) * sinAlpha;

    Float uu = cosPhi - cosAlpha;
    Float vv = sinPhi + sinAlpha * Dot(a, b) /* cos c */;
    Float cosBetap = (((vv * cosPhi - uu * sinPhi) * cosAlpha - vv) /
                      ((vv * sinPhi + uu * cosPhi) * sinAlpha));
    // Happens if the triangle basically covers the entire hemisphere.
    // We currently depend on calling code to detect this case, which
    // is sort of ugly/unfortunate.
    CHECK(!IsNaN(cosBetap));
    cosBetap = Clamp(cosBetap, -1, 1);
    Float sinBetap = SafeSqrt(1 - cosBetap * cosBetap);

    // Compute $c'$ along the arc between $b'$ and $a$
    Vector3f cp = cosBetap * a + sinBetap * Normalize(GramSchmidt(c, a));

    // Compute sampled spherical triangle direction and return barycentrics
    Float cosTheta = 1 - u[1] * (1 - Dot(cp, b));
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f w = cosTheta * b + sinTheta * Normalize(GramSchmidt(cp, b));
    // Find barycentric coordinates for sampled direction _w_
    Vector3f e1(v[1] - v[0]), e2(v[2] - v[0]);
    Vector3f s1 = Cross(w, e2);
    Float divisor = Dot(s1, e1);
    CHECK_RARE(1e-6, divisor == 0);
    if (divisor == 0) {
        // This happens with triangles that cover (nearly) the whole
        // hemisphere.
        return {1.f / 3.f, 1.f / 3.f, 1.f / 3.f};
    }
    Float invDivisor = 1 / divisor;
    Vector3f s(p - v[0]);
    Float b1 = Dot(s, s1) * invDivisor;
    Vector3f s2 = Cross(s, e1);
    Float b2 = Dot(w, s2) * invDivisor;

    // Return clamped barycentrics for sampled direction
    b1 = Clamp(b1, 0, 1);
    b2 = Clamp(b2, 0, 1);
    if (b1 + b2 > 1) {
        b1 /= b1 + b2;
        b2 /= b1 + b2;
    }
    return {Float(1 - b1 - b2), Float(b1), Float(b2)};
}